

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILS.h
# Opt level: O0

double __thiscall
imrt::ILS::notTargetedSearch(ILS *this,Plan *current_plan,int max_time,int max_iterations)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  clock_t cVar5;
  Plan *this_00;
  void *pvVar6;
  int in_ECX;
  int in_EDX;
  Plan *in_RSI;
  long *in_RDI;
  float fVar7;
  double dVar8;
  int perturbation_iteration;
  int iteration;
  int no_improvement;
  bool improvement;
  bool flag;
  double ls_time;
  double used_time;
  double best_eval;
  double aux_eval;
  double local_eval;
  Plan *best_plan;
  clock_t time_end;
  EvaluationFunction *in_stack_00000530;
  int local_6c;
  double local_60;
  double local_58;
  double local_50;
  double local_40;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"## Staring ILS search.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  cVar5 = clock();
  in_RDI[2] = cVar5;
  this_00 = (Plan *)operator_new(0xd0);
  Plan::Plan(_no_improvement,_perturbation_iteration);
  local_58 = 0.0;
  local_60 = 0.0;
  bVar3 = true;
  bVar2 = true;
  local_6c = 1;
  local_50 = Plan::getEvaluation(in_RSI);
  local_40 = local_50;
  while (bVar3) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Iteration: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6c);
    poVar4 = std::operator<<(poVar4,", eval: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,EvaluationFunction::n_evaluations);
    poVar4 = std::operator<<(poVar4,", time: ");
    fVar7 = roundf((float)(local_58 * 1000.0));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar7 / 1000.0);
    poVar4 = std::operator<<(poVar4,", best: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_50);
    poVar4 = std::operator<<(poVar4,", current: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar4,local_40);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    if (!bVar2) {
      local_40 = (double)(**(code **)(*in_RDI + 0x40))(in_RDI,in_RSI);
      poVar4 = std::operator<<((ostream *)&std::cout,"Iteration: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6c);
      poVar4 = std::operator<<(poVar4,", per: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar4,local_40);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    if (in_EDX != 0) {
      local_60 = (double)in_EDX - local_58;
    }
    dVar8 = (double)(**(code **)(*in_RDI + 0x18))(local_60,in_RDI,in_RSI,0);
    if (1e-05 < local_40 - dVar8) {
      local_40 = dVar8;
    }
    if (1e-05 < local_50 - local_40) {
      local_50 = local_40;
      Plan::newCopy(in_RSI,(Plan *)CONCAT44(in_EDX,in_ECX));
    }
    cVar5 = clock();
    dVar8 = (double)(cVar5 - in_RDI[2]) / 1000000.0;
    if ((in_EDX != 0) && ((double)in_EDX <= dVar8)) break;
    if (in_EDX != 0) {
      local_60 = (double)in_EDX - dVar8;
    }
    dVar8 = (double)(**(code **)(*in_RDI + 0x20))(local_60,in_RDI,in_RSI,0);
    bVar2 = 1e-05 < local_40 - dVar8;
    if (bVar2) {
      local_40 = dVar8;
    }
    if (1e-05 < local_50 - local_40) {
      local_50 = local_40;
      Plan::newCopy(in_RSI,(Plan *)CONCAT44(in_EDX,in_ECX));
    }
    local_6c = local_6c + 1;
    cVar5 = clock();
    local_58 = (double)(cVar5 - in_RDI[2]) / 1000000.0;
    if ((in_EDX != 0) && ((double)in_EDX <= local_58)) {
      bVar3 = false;
    }
    if ((in_ECX != 0) && (in_ECX <= local_6c)) {
      bVar3 = false;
    }
  }
  Plan::newCopy(in_RSI,(Plan *)CONCAT44(in_EDX,in_ECX));
  dVar8 = Plan::getEvaluation(in_RSI);
  Plan::getEvaluationFunction(this_00);
  EvaluationFunction::generate_voxel_dose_functions(in_stack_00000530);
  cVar5 = clock();
  lVar1 = in_RDI[2];
  poVar4 = std::operator<<((ostream *)&std::cout,"## Total used time: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar4,(double)(cVar5 - lVar1) / 1000000.0);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  return dVar8;
}

Assistant:

double notTargetedSearch(Plan& current_plan, int max_time, int max_iterations) {

    cout << "## Staring ILS search." << endl;
    std::clock_t time_end;

    //Start time
    time_begin=clock();

    //Best plan found so far
    Plan& best_plan= *new Plan(current_plan);

    double local_eval, aux_eval,  best_eval;
    double used_time=0;
    double ls_time=0;
    // flag is used for the termination criterion
    bool flag=true;
    // improvement signals a new best solution found
    bool improvement=true;
    int no_improvement, iteration=1, perturbation_iteration=0;
    no_improvement = 0;
    
    best_eval = local_eval = current_plan.getEvaluation();
    while (flag) {
      cout << "Iteration: " << iteration << ", eval: " << 
              EvaluationFunction::n_evaluations << 
              ", time: "<< (roundf(used_time * 1000) / 1000)  << 
              ", best: " << best_eval << ", current: " << 
              local_eval << endl;
      
      // Perturbate if we haven't improved last iteration
      if (!improvement) {
        local_eval = perturbation(current_plan);
        cout << "Iteration: " << iteration << ", per: " << local_eval << endl;
      }
      
      improvement = false;

      // Track the used time
      if (max_time!=0) ls_time = max_time - used_time;
      
      // Apply intensity ls
      aux_eval = iLocalSearch (current_plan, ls_time, false);
      // Check if there if there is a new solution was found
      if ((local_eval - aux_eval) > 0.00001) {
        local_eval = aux_eval;
      }
      
      // Check if there is a better global best
      if ((best_eval - local_eval) > 0.00001) {
        best_eval = local_eval;
        best_plan.newCopy(current_plan);
      }
      
      //Check print (comment if not needed)
      /*current_plan.eval();
      cout << "returned eval: " << aux_eval << " current local: " << local_eval << " in current plan: " << current_plan.getEvaluation()<< endl;
      cout << endl;
      for(int j=0;j<5;j++)
      current_plan.printIntensity(j);
      cout << endl;*/
      
      // Check termination criterion
      time_end = clock();
      used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) {
        flag = false;
        break;
      }
      // Update used time
      if (max_time!=0) ls_time = max_time-used_time;
      
      // Apply aperture ls
      aux_eval = aLocalSearch (current_plan, ls_time , false);
      // Check if there if there is a new solution was found
      if ((local_eval - aux_eval) > 0.00001) {
        local_eval = aux_eval;
        improvement = true;
      }
      
      // Check if there is a better global best
      if ((best_eval - local_eval) > 0.00001) {
        best_eval = local_eval;
        best_plan.newCopy(current_plan);
      }

      iteration++;

      // Check termination criterion
      time_end=clock();
      used_time=double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) flag = false;
      if (max_iterations!=0 && iteration>=max_iterations) flag = false;
    }

    current_plan.newCopy(best_plan);
    aux_eval = current_plan.getEvaluation();
    best_plan.getEvaluationFunction()->generate_voxel_dose_functions();
    
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    cout << "## Total used time: " << used_time << endl;
    return(aux_eval);
  }